

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O3

void __thiscall CHud::RenderWarmupTimer(CHud *this)

{
  CGameClient *pCVar1;
  CNetObj_GameData *pCVar2;
  IGraphics *pIVar3;
  ITextRender *pIVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  int64 iVar8;
  char *pcVar9;
  int64 StringVersion;
  long in_FS_OFFSET;
  float fVar10;
  char aBuf [256];
  char acStack_128 [256];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (RenderWarmupTimer()::s_Cursor == '\0') {
    iVar6 = __cxa_guard_acquire(&RenderWarmupTimer()::s_Cursor);
    if (iVar6 != 0) {
      CTextCursor::CTextCursor(&RenderWarmupTimer::s_Cursor);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderWarmupTimer::s_Cursor,&__dso_handle);
      __cxa_guard_release(&RenderWarmupTimer()::s_Cursor);
    }
  }
  RenderWarmupTimer::s_Cursor.m_MaxLines = 2;
  pCVar1 = (this->super_CComponent).m_pClient;
  pCVar2 = (pCVar1->m_Snap).m_pGameData;
  if ((pCVar2->m_GameStateFlags & 1) == 0) {
    if ((pCVar2->m_GameStateEndTick != 0) || (0 < (pCVar1->m_Snap).m_NotReadyCount)) {
      this->m_WarmupHideTick = 0;
    }
    goto LAB_001456a5;
  }
  pcVar7 = Localize("Warmup","");
  bVar5 = IsLargeWarmupTimerShown(this);
  pCVar1 = (this->super_CComponent).m_pClient;
  iVar6 = ((pCVar1->m_Snap).m_pGameData)->m_GameStateEndTick;
  if (iVar6 == 0) {
    iVar6 = (pCVar1->m_Snap).m_NotReadyCount;
    StringVersion = (int64)(int)((uint)bVar5 | g_Localization.m_CurrentVersion << 9 | iVar6 * 2);
    if (iVar6 == 1) {
      pcVar9 = "%d player not ready";
    }
    else {
      if (iVar6 < 2) {
        pcVar9 = Localize("wait for more players","");
        str_format(acStack_128,0x100,pcVar9);
        if (this->m_WarmupHideTick == 0) {
          iVar8 = time_get();
          this->m_WarmupHideTick = iVar8;
        }
        goto LAB_001454b4;
      }
      pcVar9 = "%d players not ready";
    }
    pcVar9 = Localize(pcVar9,"");
    str_format(acStack_128,0x100,pcVar9,
               (ulong)(uint)(((this->super_CComponent).m_pClient)->m_Snap).m_NotReadyCount);
    RenderReadyUpNotification(this);
  }
  else {
    fVar10 = (float)(iVar6 - pCVar1->m_pClient->m_CurGameTick) / 50.0;
    if (5.0 <= fVar10) {
      str_format(acStack_128,0x100,"%d",(ulong)(uint)(int)(fVar10 + 0.5));
    }
    else {
      str_format(acStack_128,0x100,"%.1f",(double)fVar10);
    }
    StringVersion = -1;
  }
LAB_001454b4:
  CTextCursor::Reset(&RenderWarmupTimer::s_Cursor,StringVersion);
  if (bVar5) {
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    RenderWarmupTimer::s_Cursor.m_CursorPos.field_1.y = 50.0;
    RenderWarmupTimer::s_Cursor.m_CursorPos.field_0.x =
         ((float)pIVar3->m_ScreenWidth / (float)pIVar3->m_ScreenHeight) * 150.0;
    RenderWarmupTimer::s_Cursor.m_Align = 1;
    RenderWarmupTimer::s_Cursor.m_LineSpacing = 5.0;
    RenderWarmupTimer::s_Cursor.m_FontSize = 20.0;
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar4->super_IInterface)._vptr_IInterface[7])
              (pIVar4,&RenderWarmupTimer::s_Cursor,pcVar7,0xffffffff);
    RenderWarmupTimer::s_Cursor.m_FontSize = 16.0;
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar4->super_IInterface)._vptr_IInterface[8])(pIVar4,&RenderWarmupTimer::s_Cursor);
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar4->super_IInterface)._vptr_IInterface[7])
              (pIVar4,&RenderWarmupTimer::s_Cursor,acStack_128,0xffffffff);
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x10])
              (0x3f800000,pIVar4,&RenderWarmupTimer::s_Cursor,0,0xffffffff);
  }
  else {
    RenderWarmupTimer::s_Cursor.m_CursorPos.field_0 =
         (anon_union_4_2_94730284_for_vector2_base<float>_1)0x41200000;
    RenderWarmupTimer::s_Cursor.m_CursorPos.field_1 =
         (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x42340000;
    RenderWarmupTimer::s_Cursor.m_Align = 0;
    RenderWarmupTimer::s_Cursor.m_LineSpacing = 1.0;
    (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (0x3f800000,0x3f800000,0x3f000000,0x3f800000);
    RenderWarmupTimer::s_Cursor.m_FontSize = 8.0;
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar4->super_IInterface)._vptr_IInterface[7])
              (pIVar4,&RenderWarmupTimer::s_Cursor,pcVar7,0xffffffff);
    RenderWarmupTimer::s_Cursor.m_FontSize = 6.0;
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar4->super_IInterface)._vptr_IInterface[8])(pIVar4,&RenderWarmupTimer::s_Cursor);
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar4->super_IInterface)._vptr_IInterface[7])
              (pIVar4,&RenderWarmupTimer::s_Cursor,acStack_128,0xffffffff);
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x10])
              (0x3f800000,pIVar4,&RenderWarmupTimer::s_Cursor,0,0xffffffff);
    (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  }
LAB_001456a5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderWarmupTimer()
{
	static CTextCursor s_Cursor;
	s_Cursor.m_MaxLines = 2;

	// render warmup timer
	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_WARMUP)
	{
		char aBuf[256];
		const char *pText = Localize("Warmup");
		const bool LargeTimer = IsLargeWarmupTimerShown();

		if(m_pClient->m_Snap.m_pGameData->m_GameStateEndTick == 0)
		{
			const int64 CursorVersion = g_Localization.Version() << 9 | m_pClient->m_Snap.m_NotReadyCount << 1 | (LargeTimer ? 1 : 0);
			if(m_pClient->m_Snap.m_NotReadyCount == 1)
			{
				str_format(aBuf, sizeof(aBuf), Localize("%d player not ready"), m_pClient->m_Snap.m_NotReadyCount);
				RenderReadyUpNotification();
			}
			else if(m_pClient->m_Snap.m_NotReadyCount > 1)
			{
				str_format(aBuf, sizeof(aBuf), Localize("%d players not ready"), m_pClient->m_Snap.m_NotReadyCount);
				RenderReadyUpNotification();
			}
			else
			{
				str_format(aBuf, sizeof(aBuf), Localize("wait for more players"));
				if(m_WarmupHideTick == 0)
					m_WarmupHideTick = time_get();
			}
			s_Cursor.Reset(CursorVersion);
		}
		else
		{
			float Seconds = static_cast<float>(m_pClient->m_Snap.m_pGameData->m_GameStateEndTick-Client()->GameTick())/SERVER_TICK_SPEED;
			if(Seconds < 5)
				str_format(aBuf, sizeof(aBuf), "%.1f", Seconds);
			else
				str_format(aBuf, sizeof(aBuf), "%d", round_to_int(Seconds));
			s_Cursor.Reset();
		}

		if(LargeTimer)
		{
			s_Cursor.MoveTo(150 * Graphics()->ScreenAspect(), 50);
			s_Cursor.m_Align = TEXTALIGN_TC;
			s_Cursor.m_LineSpacing = 5.0f;

			s_Cursor.m_FontSize = 20.0f;
			TextRender()->TextDeferred(&s_Cursor, pText, -1);
			s_Cursor.m_FontSize = 16.0f;
			TextRender()->TextNewline(&s_Cursor);
			TextRender()->TextDeferred(&s_Cursor, aBuf, -1);
			TextRender()->DrawTextOutlined(&s_Cursor);
		}
		else
		{
			s_Cursor.MoveTo(10, 45);
			s_Cursor.m_Align = TEXTALIGN_TL;
			s_Cursor.m_LineSpacing = 1.0f;
			
			TextRender()->TextColor(1, 1, 0.5f, 1);
			s_Cursor.m_FontSize = 8.0f;
			TextRender()->TextDeferred(&s_Cursor, pText, -1);
			s_Cursor.m_FontSize = 6.0f;
			TextRender()->TextNewline(&s_Cursor);
			TextRender()->TextDeferred(&s_Cursor, aBuf, -1);
			TextRender()->DrawTextOutlined(&s_Cursor);
			TextRender()->TextColor(1, 1, 1, 1);
		}
	}
	else if((m_pClient->m_Snap.m_pGameData->m_GameStateEndTick == 0 && m_pClient->m_Snap.m_NotReadyCount > 0) || m_pClient->m_Snap.m_pGameData->m_GameStateEndTick != 0)
		m_WarmupHideTick = 0;
}